

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionSystemData.cpp
# Opt level: O0

int __thiscall
DIS::ElectromagneticEmissionSystemData::getMarshalledSize(ElectromagneticEmissionSystemData *this)

{
  pointer pTVar1;
  int iVar2;
  int iVar3;
  pointer pTVar4;
  const_reference pvVar5;
  undefined1 local_80 [8];
  ElectromagneticEmissionBeamData listElement;
  unsigned_long_long idx;
  int marshalSize;
  ElectromagneticEmissionSystemData *this_local;
  
  iVar2 = EmitterSystem::getMarshalledSize(&this->_emitterSystem);
  iVar3 = Vector3Float::getMarshalledSize(&this->_location);
  idx._4_4_ = iVar2 + 4 + iVar3;
  listElement._trackJamTargets.
  super__Vector_base<DIS::TrackJamTarget,_std::allocator<DIS::TrackJamTarget>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    pTVar1 = listElement._trackJamTargets.
             super__Vector_base<DIS::TrackJamTarget,_std::allocator<DIS::TrackJamTarget>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pTVar4 = (pointer)std::
                      vector<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
                      ::size(&this->_beamDataRecords);
    if (pTVar4 <= pTVar1) break;
    pvVar5 = std::
             vector<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
             ::operator[](&this->_beamDataRecords,
                          (size_type)
                          listElement._trackJamTargets.
                          super__Vector_base<DIS::TrackJamTarget,_std::allocator<DIS::TrackJamTarget>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ElectromagneticEmissionBeamData::ElectromagneticEmissionBeamData
              ((ElectromagneticEmissionBeamData *)local_80,pvVar5);
    iVar2 = ElectromagneticEmissionBeamData::getMarshalledSize
                      ((ElectromagneticEmissionBeamData *)local_80);
    idx._4_4_ = idx._4_4_ + iVar2;
    ElectromagneticEmissionBeamData::~ElectromagneticEmissionBeamData
              ((ElectromagneticEmissionBeamData *)local_80);
    listElement._trackJamTargets.
    super__Vector_base<DIS::TrackJamTarget,_std::allocator<DIS::TrackJamTarget>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&(listElement._trackJamTargets.
                           super__Vector_base<DIS::TrackJamTarget,_std::allocator<DIS::TrackJamTarget>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->_vptr_TrackJamTarget
                  + 1);
  }
  return idx._4_4_;
}

Assistant:

int ElectromagneticEmissionSystemData::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 1;  // _systemDataLength
   marshalSize = marshalSize + 1;  // _numberOfBeams
   marshalSize = marshalSize + 2;  // _emissionsPadding2
   marshalSize = marshalSize + _emitterSystem.getMarshalledSize();  // _emitterSystem
   marshalSize = marshalSize + _location.getMarshalledSize();  // _location

   for(unsigned long long idx=0; idx < _beamDataRecords.size(); idx++)
   {
        ElectromagneticEmissionBeamData listElement = _beamDataRecords[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}